

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsOF.c
# Opt level: O1

void JsObjectProtoHasOwnPropertyCall
               (JsObject *obj,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  undefined1 local_38 [8];
  JsValue v;
  
  if (argc < 1) {
    v._0_8_ = "undefined";
  }
  else {
    JsToString(*argv,(JsValue *)local_38);
    (*thisobj->HasOwnProperty)(thisobj,(char *)v._0_8_,res);
  }
  (*thisobj->HasOwnProperty)(thisobj,(char *)v._0_8_,res);
  return;
}

Assistant:

static void JsObjectProtoHasOwnPropertyCall(struct JsObject *obj, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
	struct JsValue v;
	char* prop = "undefined";
	
	if(argc >0 ){
		JsToString(argv[0],&v);
		(*thisobj->HasOwnProperty)(thisobj,v.u.string,res);
		prop = v.u.string;
	}
	(*thisobj->HasOwnProperty)(thisobj,prop,res);
}